

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O1

void __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::fix_after_remove(binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,node *t)

{
  node **ppnVar1;
  node *pnVar2;
  node *pnVar3;
  node *pnVar4;
  node *pnVar5;
  node **ppnVar6;
  node *temp;
  node **ppnVar7;
  
  pnVar4 = this->tree_root;
  if (pnVar4 != t) {
    ppnVar1 = &this->tree_root;
    do {
      if (t->color != '\x01') break;
      ppnVar6 = &t->parent;
      pnVar2 = t->parent;
      pnVar5 = pnVar2->left;
      if (pnVar5 == t) {
        pnVar5 = pnVar2->right;
        if (pnVar5->color == '\0') {
          pnVar5->color = '\x01';
          pnVar2->color = '\0';
          pnVar3 = pnVar5->left;
          pnVar2->right = pnVar3;
          if (pnVar3 != this->NIL) {
            pnVar3->parent = pnVar2;
          }
          pnVar5->left = pnVar2;
          pnVar5->parent = pnVar2->parent;
          pnVar3 = pnVar5;
          ppnVar7 = ppnVar1;
          if (pnVar4 != pnVar2) {
            ppnVar7 = &pnVar2->parent->left + (pnVar2->parent->left != pnVar2);
            pnVar3 = pnVar4;
          }
          pnVar4 = pnVar3;
          *ppnVar7 = pnVar5;
          pnVar2->parent = pnVar5;
          pnVar5 = (*ppnVar6)->right;
        }
        pnVar2 = pnVar5->left;
        if ((pnVar2->color == '\x01') && (pnVar5->right->color == '\x01')) {
          pnVar5->color = '\0';
        }
        else {
          if (pnVar5->right->color == '\x01') {
            pnVar2->color = '\x01';
            pnVar5->color = '\0';
            pnVar3 = pnVar2->right;
            pnVar5->left = pnVar3;
            if (pnVar3 != this->NIL) {
              pnVar3->parent = pnVar5;
            }
            pnVar2->right = pnVar5;
            pnVar2->parent = pnVar5->parent;
            pnVar3 = pnVar2;
            ppnVar7 = ppnVar1;
            if (pnVar4 != pnVar5) {
              ppnVar7 = &pnVar5->parent->left + (pnVar5->parent->left != pnVar5);
              pnVar3 = pnVar4;
            }
            pnVar4 = pnVar3;
            *ppnVar7 = pnVar2;
            pnVar5->parent = pnVar2;
            pnVar5 = (*ppnVar6)->right;
          }
          pnVar2 = *ppnVar6;
          pnVar5->color = pnVar2->color;
          pnVar2->color = '\x01';
          pnVar5->right->color = '\x01';
          pnVar5 = pnVar2->right;
          pnVar3 = pnVar5->left;
          pnVar2->right = pnVar3;
          if (pnVar3 != this->NIL) {
            pnVar3->parent = pnVar2;
          }
          pnVar5->left = pnVar2;
          pnVar5->parent = pnVar2->parent;
          ppnVar6 = ppnVar1;
          pnVar3 = pnVar5;
          if (pnVar4 != pnVar2) {
            ppnVar6 = &pnVar2->parent->left + (pnVar2->parent->left != pnVar2);
            pnVar3 = pnVar4;
          }
          pnVar4 = pnVar3;
          *ppnVar6 = pnVar5;
          pnVar2->parent = pnVar5;
          ppnVar6 = ppnVar1;
        }
      }
      else {
        if (pnVar5->color == '\0') {
          pnVar5->color = '\x01';
          pnVar2->color = '\0';
          pnVar3 = pnVar5->right;
          pnVar2->left = pnVar3;
          if (pnVar3 != this->NIL) {
            pnVar3->parent = pnVar2;
          }
          pnVar5->right = pnVar2;
          pnVar5->parent = pnVar2->parent;
          pnVar3 = pnVar5;
          ppnVar7 = ppnVar1;
          if (pnVar4 != pnVar2) {
            ppnVar7 = &pnVar2->parent->left + (pnVar2->parent->left != pnVar2);
            pnVar3 = pnVar4;
          }
          pnVar4 = pnVar3;
          *ppnVar7 = pnVar5;
          pnVar2->parent = pnVar5;
          pnVar5 = (*ppnVar6)->left;
        }
        if (pnVar5->left->color == '\x01') {
          if (pnVar5->right->color == '\x01') {
            pnVar5->color = '\0';
            goto LAB_00245c2e;
          }
          pnVar2 = pnVar5->right;
          pnVar2->color = '\x01';
          pnVar5->color = '\0';
          pnVar3 = pnVar2->left;
          pnVar5->right = pnVar3;
          if (pnVar3 != this->NIL) {
            pnVar3->parent = pnVar5;
          }
          pnVar2->left = pnVar5;
          pnVar2->parent = pnVar5->parent;
          pnVar3 = pnVar2;
          ppnVar7 = ppnVar1;
          if (pnVar4 != pnVar5) {
            ppnVar7 = &pnVar5->parent->left + (pnVar5->parent->left != pnVar5);
            pnVar3 = pnVar4;
          }
          pnVar4 = pnVar3;
          *ppnVar7 = pnVar2;
          pnVar5->parent = pnVar2;
          pnVar5 = (*ppnVar6)->left;
        }
        pnVar2 = *ppnVar6;
        pnVar5->color = pnVar2->color;
        pnVar2->color = '\x01';
        pnVar5->left->color = '\x01';
        pnVar5 = pnVar2->left;
        pnVar3 = pnVar5->right;
        pnVar2->left = pnVar3;
        if (pnVar3 != this->NIL) {
          pnVar3->parent = pnVar2;
        }
        pnVar5->right = pnVar2;
        pnVar5->parent = pnVar2->parent;
        ppnVar6 = ppnVar1;
        pnVar3 = pnVar5;
        if (pnVar4 != pnVar2) {
          ppnVar6 = &pnVar2->parent->left + (pnVar2->parent->left != pnVar2);
          pnVar3 = pnVar4;
        }
        pnVar4 = pnVar3;
        *ppnVar6 = pnVar5;
        pnVar2->parent = pnVar5;
        ppnVar6 = ppnVar1;
      }
LAB_00245c2e:
      t = *ppnVar6;
    } while (t != pnVar4);
  }
  t->color = '\x01';
  return;
}

Assistant:

void binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    fix_after_remove (
        node* t
    )
    {

        while (t != tree_root && t->color == black)
        {
            if (t->parent->left == t)
            {
                node* sibling = t->parent->right;
                if (sibling->color == red)
                {
                    sibling->color = black;
                    t->parent->color = red;
                    rotate_left(t->parent);
                    sibling = t->parent->right;
                }

                if (sibling->left->color == black && sibling->right->color == black)
                {
                    sibling->color = red;
                    t = t->parent;
                }
                else
                {
                    if (sibling->right->color == black)
                    {
                        sibling->left->color = black;
                        sibling->color = red;
                        rotate_right(sibling);
                        sibling = t->parent->right;
                    }

                    sibling->color = t->parent->color;
                    t->parent->color = black;
                    sibling->right->color = black;
                    rotate_left(t->parent);
                    t = tree_root;

                }


            }
            else
            {

                node* sibling = t->parent->left;
                if (sibling->color == red)
                {
                    sibling->color = black;
                    t->parent->color = red;
                    rotate_right(t->parent);
                    sibling = t->parent->left;
                }

                if (sibling->left->color == black && sibling->right->color == black)
                {
                    sibling->color = red;
                    t = t->parent;
                }
                else
                {
                    if (sibling->left->color == black)
                    {
                        sibling->right->color = black;
                        sibling->color = red;
                        rotate_left(sibling);
                        sibling = t->parent->left;
                    }

                    sibling->color = t->parent->color;
                    t->parent->color = black;
                    sibling->left->color = black;
                    rotate_right(t->parent);
                    t = tree_root;

                }


            }

        }
        t->color = black;
    
    }